

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

ON_wString __thiscall ON_wString::Mid(ON_wString *this,int i,int count)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ON_Internal_Empty_wString *pOVar4;
  int in_ECX;
  undefined4 in_register_00000034;
  
  if (-1 < count) {
    lVar2 = *(long *)CONCAT44(in_register_00000034,i);
    pOVar4 = &empty_wstring;
    if (lVar2 != 0) {
      pOVar4 = (ON_Internal_Empty_wString *)(lVar2 + -0xc);
    }
    if (((0 < in_ECX) &&
        (iVar1 = (pOVar4->header).string_length, iVar3 = iVar1 - count, iVar3 != 0 && count <= iVar1
        )) && ((in_ECX <= iVar3 || (in_ECX = iVar3, 0 < iVar3)))) {
      ON_wString(this);
      CopyToArray(this,in_ECX,
                  (wchar_t *)((ulong)(uint)count * 4 + *(long *)CONCAT44(in_register_00000034,i)));
      return (ON_wString)(wchar_t *)this;
    }
  }
  ON_wString(this,&EmptyString);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_wString::Mid(int i, int count) const
{
  if ( i >= 0 && i < Length() && count > 0 )
  {
    if ( count > Length() - i )
      count = Length() - i;
    if (count > 0)
    {
      ON_wString s;
      s.CopyToArray(count, &m_s[i]);
      return s;
    }
  }
  return ON_wString::EmptyString;
}